

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall cursespp::Window::~Window(Window *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  (this->super_IWindow).super_IOrderable._vptr_IOrderable = (_func_int **)&PTR__Window_001ab348;
  (this->super_IWindow).super_IDisplayable._vptr_IDisplayable = (_func_int **)&DAT_001ab518;
  (this->super_IWindow).super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__Window_001ab548;
  (this->super_IWindow).super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__Window_001ab570;
  (**(code **)(messageQueue + 0x40))(&messageQueue,&(this->super_IWindow).super_IMessageTarget);
  if (top == this) {
    top = (Window *)0x0;
  }
  if (focused == this) {
    focused = (Window *)0x0;
  }
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])(this);
  pcVar3 = (this->title)._M_dataplus._M_p;
  paVar2 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  (this->MouseEvent).
  super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  .super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__signal2_001ab8e8;
  sigslot::
  _signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
  ::~_signal_base2(&(this->MouseEvent).
                    super__signal_base2<cursespp::Window_*,_const_cursespp::IMouseHandler::Event_*,_sigslot::multi_threaded_local>
                  );
  p_Var4 = (this->super_enable_shared_from_this<cursespp::IWindow>)._M_weak_this.
           super___weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Window::~Window() {
    Window::MessageQueue().Unregister(this);
    if (::top == this) { top = nullptr; }
    if (::focused == this) { focused = nullptr; }
    this->Destroy();
}